

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedNumberFormat::adoptDecimalFormatSymbols
          (RuleBasedNumberFormat *this,DecimalFormatSymbols *symbolsToAdopt)

{
  NFRule *pNVar1;
  uint in_EAX;
  DecimalFormatSymbols *p;
  UErrorCode *status_00;
  long lVar2;
  UErrorCode status;
  undefined8 uStack_28;
  
  if (symbolsToAdopt != (DecimalFormatSymbols *)0x0) {
    p = symbolsToAdopt;
    uStack_28._0_4_ = in_EAX;
    if (this->decimalFormatSymbols != (DecimalFormatSymbols *)0x0) {
      (*(this->decimalFormatSymbols->super_UObject)._vptr_UObject[1])();
    }
    this->decimalFormatSymbols = symbolsToAdopt;
    uStack_28 = (ulong)(uint)uStack_28;
    pNVar1 = this->defaultInfinityRule;
    if (pNVar1 != (NFRule *)0x0) {
      NFRule::~NFRule(pNVar1);
      UMemory::operator_delete((UMemory *)pNVar1,p);
    }
    this->defaultInfinityRule = (NFRule *)0x0;
    status_00 = (UErrorCode *)((long)&uStack_28 + 4);
    initializeDefaultInfinityRule(this,status_00);
    pNVar1 = this->defaultNaNRule;
    if (pNVar1 != (NFRule *)0x0) {
      NFRule::~NFRule(pNVar1);
      UMemory::operator_delete((UMemory *)pNVar1,status_00);
    }
    this->defaultNaNRule = (NFRule *)0x0;
    initializeDefaultNaNRule(this,(UErrorCode *)((long)&uStack_28 + 4));
    if ((this->fRuleSets != (NFRuleSet **)0x0) && (0 < this->numRuleSets)) {
      lVar2 = 0;
      do {
        NFRuleSet::setDecimalFormatSymbols
                  (this->fRuleSets[lVar2],symbolsToAdopt,(UErrorCode *)((long)&uStack_28 + 4));
        lVar2 = lVar2 + 1;
      } while (lVar2 < this->numRuleSets);
    }
  }
  return;
}

Assistant:

void
RuleBasedNumberFormat::adoptDecimalFormatSymbols(DecimalFormatSymbols* symbolsToAdopt)
{
    if (symbolsToAdopt == NULL) {
        return; // do not allow caller to set decimalFormatSymbols to NULL
    }

    if (decimalFormatSymbols != NULL) {
        delete decimalFormatSymbols;
    }

    decimalFormatSymbols = symbolsToAdopt;

    {
        // Apply the new decimalFormatSymbols by reparsing the rulesets
        UErrorCode status = U_ZERO_ERROR;

        delete defaultInfinityRule;
        defaultInfinityRule = NULL;
        initializeDefaultInfinityRule(status); // Reset with the new DecimalFormatSymbols

        delete defaultNaNRule;
        defaultNaNRule = NULL;
        initializeDefaultNaNRule(status); // Reset with the new DecimalFormatSymbols

        if (fRuleSets) {
            for (int32_t i = 0; i < numRuleSets; i++) {
                fRuleSets[i]->setDecimalFormatSymbols(*symbolsToAdopt, status);
            }
        }
    }
}